

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void selftouch(char *arg)

{
  char *pcVar1;
  char local_118 [8];
  char kbuf [256];
  char *arg_local;
  
  if ((((uwep != (obj *)0x0) && (uwep->otyp == 0x10e)) &&
      ((((long)uwep->corpsenm & 0x3ffffffffffffffU) == 0xc ||
       (((long)uwep->corpsenm & 0x3ffffffffffffffU) == 0xb)))) &&
     ((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)))) {
    pcVar1 = mons_mname(mons + uwep->corpsenm);
    pline("%s touch the %s corpse.",arg,pcVar1);
    pcVar1 = mons_mname(mons + uwep->corpsenm);
    pcVar1 = an(pcVar1);
    sprintf(local_118,"%s corpse",pcVar1);
    delayed_petrify((char *)0x0,local_118);
    if ((u.uprops[8].extrinsic == 0) &&
       (((youmonst.mintrinsics & 0x80) == 0 && (uarmg == (obj *)0x0)))) {
      pcVar1 = mons_mname(mons + uwep->corpsenm);
      pline("You release the %s corpse!",pcVar1);
      uwepgone();
    }
  }
  if (((((u.twoweap != '\0') && (uswapwep != (obj *)0x0)) && (uswapwep->otyp == 0x10e)) &&
      ((((long)uswapwep->corpsenm & 0x3ffffffffffffffU) == 0xc ||
       (((long)uswapwep->corpsenm & 0x3ffffffffffffffU) == 0xb)))) &&
     ((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)))) {
    pcVar1 = mons_mname(mons + uswapwep->corpsenm);
    pline("%s touch the %s corpse.",arg,pcVar1);
    pcVar1 = mons_mname(mons + uswapwep->corpsenm);
    pcVar1 = an(pcVar1);
    sprintf(local_118,"%s corpse",pcVar1);
    delayed_petrify((char *)0x0,local_118);
    if (((u.uprops[8].extrinsic == 0) && ((youmonst.mintrinsics & 0x80) == 0)) &&
       (uarmg == (obj *)0x0)) {
      pcVar1 = mons_mname(mons + uwep->corpsenm);
      pline("You release the %s corpse!",pcVar1);
      uswapwepgone();
    }
  }
  return;
}

Assistant:

void selftouch(const char *arg)
{
	char kbuf[BUFSZ];

	if (uwep && uwep->otyp == CORPSE && touch_petrifies(&mons[uwep->corpsenm])
			&& !Stone_resistance) {
		pline("%s touch the %s corpse.", arg,
		        mons_mname(&mons[uwep->corpsenm]));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uwep->corpsenm])));
		delayed_petrify(NULL, kbuf);
		if (!Stone_resistance && !uarmg) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uwep->corpsenm]));
		    uwepgone();
		}
	}
	/* Or your secondary weapon, if wielded */
	if (u.twoweap && uswapwep && uswapwep->otyp == CORPSE &&
			touch_petrifies(&mons[uswapwep->corpsenm]) && !Stone_resistance){
		pline("%s touch the %s corpse.", arg,
		        mons_mname(&mons[uswapwep->corpsenm]));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uswapwep->corpsenm])));
		delayed_petrify(NULL, kbuf);
		if (!Stone_resistance && !uarmg) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uwep->corpsenm]));
		    uswapwepgone();
		}
	}
}